

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl.h
# Opt level: O0

void __thiscall
flatbuffers::SymbolTable<flatbuffers::Type>::~SymbolTable(SymbolTable<flatbuffers::Type> *this)

{
  bool bVar1;
  reference ppTVar2;
  __normal_iterator<flatbuffers::Type_**,_std::vector<flatbuffers::Type_*,_std::allocator<flatbuffers::Type_*>_>_>
  local_20;
  __normal_iterator<flatbuffers::Type_**,_std::vector<flatbuffers::Type_*,_std::allocator<flatbuffers::Type_*>_>_>
  local_18;
  iterator it;
  SymbolTable<flatbuffers::Type> *this_local;
  
  it._M_current = (Type **)this;
  local_18._M_current =
       (Type **)std::vector<flatbuffers::Type_*,_std::allocator<flatbuffers::Type_*>_>::begin
                          (&this->vec);
  while( true ) {
    local_20._M_current =
         (Type **)std::vector<flatbuffers::Type_*,_std::allocator<flatbuffers::Type_*>_>::end
                            (&this->vec);
    bVar1 = __gnu_cxx::operator!=(&local_18,&local_20);
    if (!bVar1) break;
    ppTVar2 = __gnu_cxx::
              __normal_iterator<flatbuffers::Type_**,_std::vector<flatbuffers::Type_*,_std::allocator<flatbuffers::Type_*>_>_>
              ::operator*(&local_18);
    if (*ppTVar2 != (Type *)0x0) {
      operator_delete(*ppTVar2,0x20);
    }
    __gnu_cxx::
    __normal_iterator<flatbuffers::Type_**,_std::vector<flatbuffers::Type_*,_std::allocator<flatbuffers::Type_*>_>_>
    ::operator++(&local_18);
  }
  std::vector<flatbuffers::Type_*,_std::allocator<flatbuffers::Type_*>_>::~vector(&this->vec);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Type_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_flatbuffers::Type_*>_>_>
  ::~map(&this->dict);
  return;
}

Assistant:

~SymbolTable() {
    for (auto it = vec.begin(); it != vec.end(); ++it) { delete *it; }
  }